

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

void __thiscall
PDA::Transducer::Grammar::Rule::Rule<wchar_t[6],wchar_t[5],wchar_t[1]>
          (Rule *this,wchar_t leftSide,wchar_t (*first) [6],wchar_t (*rest) [5],
          wchar_t (*rest_1) [1])

{
  (this->m_chains).
  super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chains).
  super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chains).
  super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_errorString)._M_dataplus._M_p = (pointer)&(this->m_errorString).field_2;
  (this->m_errorString)._M_string_length = 0;
  (this->m_errorString).field_2._M_local_buf[0] = L'\0';
  this->m_left = leftSide;
  addChains<wchar_t[6],wchar_t[5],wchar_t[1]>(this,first,rest,rest_1);
  return;
}

Assistant:

Rule(const wchar_t leftSide, const First &first, const Rest&... rest)
        {
            m_left = leftSide;
            addChains(first, rest...);
        }